

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O1

int unlzw(FILE *in,FILE *out)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  voidp buf;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ush *puVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ush *puVar17;
  ush *puVar18;
  ush *puVar19;
  long lVar20;
  long lVar21;
  voidp pvVar22;
  ush *puVar23;
  bool bVar24;
  ulong local_80;
  ulong local_70;
  
  uVar3 = (ulong)inptr;
  ofd = out;
  if (inptr < insize) {
    inptr = inptr + 1;
    maxbits = (int)inbuf[uVar3];
  }
  else {
    maxbits = fill_inbuf((int)in);
  }
  block_mode = maxbits & 0x80;
  if ((maxbits & 0x60U) != 0) {
    ffpmsg(ifname);
    ffpmsg("warning, unknown flags in unlzw decompression");
  }
  iVar14 = block_mode;
  maxbits = maxbits & 0x1f;
  uVar3 = 1L << (sbyte)maxbits;
  if ((uint)maxbits < 0x11) {
    local_80 = (ulong)insize;
    uVar15 = inptr << 3;
    memset(prev,0,0x100);
    lVar4 = 0xff;
    do {
      window[lVar4] = (uch)lVar4;
      bVar24 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar24);
    uVar13 = (ulong)uVar15;
    lVar4 = 0x101 - (ulong)(iVar14 == 0);
    uVar9 = 9;
    local_70 = 0x1ff;
    uVar8 = 0x1ff;
    puVar18 = (ush *)0xffffffffffffffff;
    pvVar22 = (voidp)0x0;
    uVar15 = 0;
LAB_002050b1:
    iVar14 = (int)uVar9;
    lVar5 = (long)iVar14;
    puVar23 = puVar18;
    do {
      iVar12 = (int)(uVar13 >> 3);
      insize = insize - iVar12;
      if (0 < (int)insize) {
        uVar13 = 0;
        do {
          lVar21 = (long)iVar12 + uVar13;
          puVar18 = (ush *)CONCAT71((int7)((ulong)lVar21 >> 8),inbuf[lVar21]);
          inbuf[uVar13] = inbuf[lVar21];
          uVar13 = uVar13 + 1;
        } while (insize != uVar13);
      }
      if (insize < 0x40) {
        puVar18 = (ush *)0x1;
        local_80 = fread(inbuf + insize,1,0x8000,(FILE *)in);
        iVar12 = (int)local_80;
        if (iVar12 != -1) {
          insize = insize + iVar12;
          bytes_in = bytes_in + iVar12;
          goto LAB_00205157;
        }
        ffpmsg(ifname);
        ffpmsg("unexpected end of file");
        local_80 = 0xffffffff;
        uVar13 = 0;
LAB_00205410:
        bVar24 = false;
      }
      else {
LAB_00205157:
        uVar13 = (ulong)insize;
        if ((int)local_80 == 0) {
          lVar21 = uVar13 * 8 - (long)(iVar14 + -1);
        }
        else {
          lVar21 = (uVar13 - uVar13 % uVar9) * 8;
        }
        bVar24 = true;
        if (lVar21 < 1) {
          uVar13 = 0;
        }
        else {
          buf = (voidp)((ulong)pvVar22 & 0xffffffff);
          lVar6 = 0;
          puVar18 = puVar23;
          do {
            pvVar22 = (voidp)(long)(int)buf;
            lVar20 = (long)pvVar22 << 0x20;
            lVar2 = lVar6;
            puVar17 = puVar18;
            uVar7 = uVar15;
            while( true ) {
              lVar10 = lVar2;
              if ((long)local_70 < lVar4) {
                lVar5 = lVar6 + iVar14 * 8 + -1;
                uVar8 = iVar14 + 1;
                uVar9 = (ulong)uVar8;
                uVar13 = lVar5 - lVar5 % (long)(iVar14 * 8);
                local_70 = ~(-1L << ((byte)uVar8 & 0x3f));
                if (uVar8 == maxbits) {
                  local_70 = uVar3;
                }
                uVar8 = ~(-1 << ((byte)uVar8 & 0x1f));
                pvVar22 = buf;
                goto LAB_002050b1;
              }
              uVar16 = *(uint3 *)(inbuf + (lVar10 >> 3)) >> ((byte)lVar10 & 7) & uVar8;
              puVar23 = (ush *)(ulong)uVar16;
              puVar19 = puVar18;
              if (puVar17 != (ush *)0xffffffffffffffff) break;
              if (0xff < uVar16) {
                ffpmsg(ifname);
                ffpmsg("corrupt input.");
                uVar13 = lVar10 + lVar5;
                puVar23 = (ush *)0xffffffffffffffff;
                bVar24 = false;
                uVar15 = uVar7;
                goto LAB_00205459;
              }
              *(char *)((long)pvVar22 + 0x3c3dc0) = (char)uVar16;
              pvVar22 = (voidp)((long)pvVar22 + 1);
              lVar20 = lVar20 + 0x100000000;
              lVar2 = lVar5 + lVar10;
              puVar17 = puVar23;
              uVar7 = uVar16;
              if (lVar21 <= lVar5 + lVar10) goto LAB_00205452;
            }
            if ((uVar16 == 0x100) && (block_mode != 0)) {
              memset(prev,0,0x100);
              lVar4 = 0x100;
              lVar5 = lVar10 + lVar5 + (iVar14 << 3) + -1;
              uVar13 = lVar5 - lVar5 % (long)(iVar14 << 3);
              uVar8 = 0x1ff;
              local_70 = 0x1ff;
              uVar9 = 9;
              puVar18 = puVar17;
              pvVar22 = (voidp)((ulong)pvVar22 & 0xffffffff);
              uVar15 = uVar7;
              goto LAB_002050b1;
            }
            lVar6 = 0x3d85be;
            puVar11 = puVar23;
            if (lVar4 <= (long)puVar23) {
              if (lVar4 < (long)puVar23) {
                if (0 < (long)pvVar22) {
                  write_buf((voidp)((ulong)pvVar22 & 0xffffffff),(uint)puVar18);
                  bytes_out = bytes_out + ((ulong)pvVar22 & 0xffffffff);
                }
                uVar13 = lVar10 + lVar5;
                ffpmsg(ifname);
                ffpmsg("corrupt input.");
                puVar23 = puVar17;
                uVar15 = uVar7;
                goto LAB_00205410;
              }
              d_buf[0x7ffe]._1_1_ = (undefined1)uVar7;
              lVar6 = 0x3d85bd;
              puVar11 = puVar17;
            }
            if ((ush *)0xff < puVar11) {
              puVar19 = prev;
              do {
                *(char *)(lVar6 + -1) = (char)puVar11[0x1d9ee0];
                lVar6 = lVar6 + -1;
                puVar11 = (ush *)(ulong)prev[(long)puVar11];
              } while ((ush *)0xff < puVar11);
            }
            bVar1 = (byte)puVar11[0x1d9ee0];
            puVar18 = (ush *)(lVar6 + -1);
            *(byte *)(lVar6 + -1) = bVar1;
            uVar7 = 0x3d85be - (int)puVar18;
            uVar15 = ((int)pvVar22 - (int)lVar6) + 0x3d85bf;
            buf = (voidp)(ulong)uVar15;
            if ((int)uVar15 < 0x4000) {
              memcpy(outbuf + (lVar20 >> 0x20),puVar18,(long)(int)uVar7);
              puVar19 = puVar18;
            }
            else {
              buf = (voidp)((ulong)pvVar22 & 0xffffffff);
              do {
                iVar12 = (int)buf;
                uVar15 = 0x4000U - iVar12;
                if ((int)uVar7 < (int)(0x4000U - iVar12)) {
                  uVar15 = uVar7;
                }
                if (0 < (int)uVar15) {
                  puVar19 = puVar18;
                  memcpy(outbuf + iVar12,puVar18,(ulong)uVar15);
                  buf = (voidp)(ulong)(iVar12 + uVar15);
                }
                if (0x3fff < (int)buf) {
                  write_buf(buf,(uint)puVar19);
                  bytes_out = bytes_out + (long)buf;
                  buf = (voidp)0x0;
                }
                puVar18 = (ush *)((long)puVar18 + (long)(int)uVar15);
                uVar7 = 0x3d85be - (int)puVar18;
              } while (0 < (int)uVar7);
            }
            if (lVar4 < (long)uVar3) {
              prev[lVar4] = (ush)puVar17;
              window[lVar4] = bVar1;
              lVar4 = lVar4 + 1;
            }
            lVar6 = lVar5 + lVar10;
            uVar16 = (uint)bVar1;
            puVar18 = puVar23;
            pvVar22 = buf;
            uVar15 = uVar16;
          } while (lVar6 < lVar21);
LAB_00205452:
          uVar13 = lVar10 + lVar5;
          bVar24 = true;
          puVar18 = puVar19;
          uVar15 = uVar16;
        }
      }
LAB_00205459:
      if (!bVar24) goto LAB_00205024;
    } while ((int)local_80 != 0);
    iVar14 = 0;
    if (0 < (int)pvVar22) {
      write_buf((voidp)((ulong)pvVar22 & 0xffffffff),(uint)puVar18);
      bytes_out = bytes_out + ((ulong)pvVar22 & 0xffffffff);
      iVar14 = 0;
    }
  }
  else {
    ffpmsg(ifname);
    ffpmsg("compressed with too many bits; cannot handle file");
LAB_00205024:
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}